

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O0

void duckdb::LogicalJoin::GetTableReferences
               (LogicalOperator *op,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *bindings)

{
  bool bVar1;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar2;
  ColumnBinding binding;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ColumnBinding,_true> *__range1;
  vector<duckdb::ColumnBinding,_true> column_bindings;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffff80;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  __normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [40];
  
  (**(code **)(*in_RDI + 0x10))(local_28);
  local_30 = local_28;
  local_38._M_current =
       (ColumnBinding *)
       ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::begin
                 ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::end
            ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                        *)in_stack_ffffffffffffff80._M_cur,
                       (__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
    ::operator*(&local_38);
    pVar2 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                     (value_type *)in_stack_ffffffffffffff88._M_cur);
    in_stack_ffffffffffffff80._M_cur =
         (__node_type *)pVar2.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    in_stack_ffffffffffffff7f = pVar2.second;
    in_stack_ffffffffffffff88._M_cur = in_stack_ffffffffffffff80._M_cur;
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff7f;
    __gnu_cxx::
    __normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
    ::operator++(&local_38);
  }
  vector<duckdb::ColumnBinding,_true>::~vector((vector<duckdb::ColumnBinding,_true> *)0xe610b2);
  return;
}

Assistant:

void LogicalJoin::GetTableReferences(LogicalOperator &op, unordered_set<idx_t> &bindings) {
	auto column_bindings = op.GetColumnBindings();
	for (auto binding : column_bindings) {
		bindings.insert(binding.table_index);
	}
}